

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s98c.c
# Opt level: O2

void free_context(s98c *ctx)

{
  long lVar1;
  int i;
  ulong uVar2;
  
  free(ctx->devices);
  if (ctx->tags != (s98taginfo *)0x0) {
    lVar1 = 0;
    for (uVar2 = 0; uVar2 < ctx->tags_count; uVar2 = uVar2 + 1) {
      free(*(void **)((long)&ctx->tags->key + lVar1));
      free(*(void **)((long)&ctx->tags->value + lVar1));
      lVar1 = lVar1 + 0x10;
    }
    free(ctx->tags);
  }
  free(ctx->dump_buffer);
  free(ctx->source_encoding);
  return;
}

Assistant:

void free_context(struct s98c* ctx)
{
    if(ctx->devices != NULL) {
        free(ctx->devices);
    }
    if(ctx->tags != NULL) {
        int i;
        for(i = 0; i < ctx->tags_count; i++) {
            free(ctx->tags[i].key);
            free(ctx->tags[i].value);
        }
        free(ctx->tags);
    }
    if(ctx->dump_buffer != NULL) {
        free(ctx->dump_buffer);
    }
    if(ctx->source_encoding != NULL) {
        free(ctx->source_encoding);
    }
}